

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O0

int OBJ_txt2nid(char *s)

{
  int iVar1;
  ASN1_OBJECT *o;
  int nid;
  ASN1_OBJECT *obj;
  char *s_local;
  
  o = OBJ_txt2obj(s,0);
  iVar1 = OBJ_obj2nid(o);
  ASN1_OBJECT_free(o);
  return iVar1;
}

Assistant:

int OBJ_txt2nid(const char *s) {
  ASN1_OBJECT *obj;
  int nid;

  obj = OBJ_txt2obj(s, 0 /* search names */);
  nid = OBJ_obj2nid(obj);
  ASN1_OBJECT_free(obj);
  return nid;
}